

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<float,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          float **transitionMatrices,int count)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int iVar7;
  long lVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R9;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  long in_stack_00000008;
  int in_stack_00000010;
  int k;
  float sum;
  int j_2;
  int i_1;
  int j_1;
  float expatsinbt;
  float expatcosbt;
  float expat;
  float b;
  int i2;
  int j;
  float tmp;
  int i;
  float *EvalImag;
  float *Eval;
  float *Evec;
  float *Ievc;
  float distance;
  int l;
  int n;
  double edgeLength;
  float *transitionMat;
  int u;
  int local_ac;
  float local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_84;
  int local_7c;
  int local_50;
  int local_4c;
  int local_34;
  
  for (local_34 = 0; local_34 < in_stack_00000010; local_34 = local_34 + 1) {
    lVar2 = *(long *)(in_stack_00000008 + (long)*(int *)(in_RDX + (long)local_34 * 4) * 8);
    dVar1 = *(double *)(in_R9 + (long)local_34 * 8);
    local_4c = 0;
    for (local_50 = 0; local_50 < *(int *)(in_RDI + 0x18); local_50 = local_50 + 1) {
      fVar9 = (float)dVar1;
      lVar3 = *(long *)(*(long *)(in_RDI + 0x48) + (long)*(int *)(in_RSI + (long)local_50 * 4) * 8);
      lVar4 = *(long *)(*(long *)(in_RDI + 0x40) + (long)*(int *)(in_RSI + (long)local_50 * 4) * 8);
      lVar5 = *(long *)(*(long *)(in_RDI + 8) + (long)*(int *)(in_RSI + (long)local_50 * 4) * 8);
      lVar8 = lVar5 + (long)*(int *)(in_RDI + 0x10) * 4;
      for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x10); local_7c = local_7c + 1) {
        if (((*(byte *)(in_RDI + 0x50) & 1) == 0) ||
           ((fVar11 = *(float *)(lVar8 + (long)local_7c * 4), fVar11 == 0.0 && (!NAN(fVar11))))) {
          dVar12 = exp((double)(*(float *)(lVar5 + (long)local_7c * 4) * fVar9));
          for (local_84 = 0; local_84 < *(int *)(in_RDI + 0x10); local_84 = local_84 + 1) {
            *(float *)(*(long *)(in_RDI + 0x28) +
                      (long)(local_7c * *(int *)(in_RDI + 0x10) + local_84) * 4) =
                 *(float *)(lVar3 + (long)(local_7c * *(int *)(in_RDI + 0x10) + local_84) * 4) *
                 (float)dVar12;
          }
        }
        else {
          iVar7 = local_7c + 1;
          fVar11 = *(float *)(lVar8 + (long)local_7c * 4);
          dVar12 = exp((double)(*(float *)(lVar5 + (long)local_7c * 4) * fVar9));
          dVar13 = cos((double)(fVar11 * fVar9));
          fVar10 = (float)((double)(float)dVar12 * dVar13);
          dVar13 = sin((double)(fVar11 * fVar9));
          fVar11 = (float)((double)(float)dVar12 * dVar13);
          for (local_9c = 0; local_9c < *(int *)(in_RDI + 0x10); local_9c = local_9c + 1) {
            auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar3 + (long)(local_7c *
                                                                      *(int *)(in_RDI + 0x10) +
                                                                     local_9c) * 4)),
                                     ZEXT416((uint)fVar10),
                                     ZEXT416((uint)(fVar11 * *(float *)(lVar3 + (long)(iVar7 * *(int
                                                                                                 *)(
                                                  in_RDI + 0x10) + local_9c) * 4))));
            *(int *)(*(long *)(in_RDI + 0x28) +
                    (long)(local_7c * *(int *)(in_RDI + 0x10) + local_9c) * 4) = auVar6._0_4_;
            auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar3 + (long)(iVar7 * *(int *)(in_RDI + 0x10
                                                                                      ) + local_9c)
                                                               * 4)),ZEXT416((uint)fVar10),
                                     ZEXT416((uint)-(fVar11 * *(float *)(lVar3 + (long)(local_7c *
                                                                                        *(int *)(
                                                  in_RDI + 0x10) + local_9c) * 4))));
            *(int *)(*(long *)(in_RDI + 0x28) +
                    (long)(iVar7 * *(int *)(in_RDI + 0x10) + local_9c) * 4) = auVar6._0_4_;
          }
          local_7c = local_7c + 1;
        }
      }
      for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x10); local_a0 = local_a0 + 1) {
        for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0x10); local_a4 = local_a4 + 1) {
          local_a8 = 0.0;
          for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x10); local_ac = local_ac + 1) {
            auVar6 = vfmadd213ss_fma(ZEXT416(*(uint *)(*(long *)(in_RDI + 0x28) +
                                                      (long)(local_ac * *(int *)(in_RDI + 0x10) +
                                                            local_a4) * 4)),
                                     ZEXT416(*(uint *)(lVar4 + (long)(local_a0 *
                                                                      *(int *)(in_RDI + 0x10) +
                                                                     local_ac) * 4)),
                                     ZEXT416((uint)local_a8));
            local_a8 = auVar6._0_4_;
          }
          if (local_a8 <= 0.0) {
            *(undefined4 *)(lVar2 + (long)local_4c * 4) = 0;
          }
          else {
            *(float *)(lVar2 + (long)local_4c * 4) = local_a8;
          }
          local_4c = local_4c + 1;
        }
        *(undefined4 *)(lVar2 + (long)local_4c * 4) = 0x3f800000;
        local_4c = local_4c + 1;
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}